

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O2

uintptr_t ngx_radix32tree_find(ngx_radix_tree_t *tree,uint32_t key)

{
  ngx_radix_node_t *pnVar1;
  uint uVar2;
  uintptr_t value;
  uintptr_t uVar3;
  uint32_t bit;
  uint uVar4;
  
  uVar3 = 0xffffffffffffffff;
  uVar4 = 0x80000000;
  while (pnVar1 = tree->root, pnVar1 != (ngx_radix_node_t *)0x0) {
    if (pnVar1->value != 0xffffffffffffffff) {
      uVar3 = pnVar1->value;
    }
    uVar2 = uVar4 & key;
    uVar4 = uVar4 >> 1;
    tree = (ngx_radix_tree_t *)(&pnVar1->right + (uVar2 == 0));
  }
  return uVar3;
}

Assistant:

uintptr_t
ngx_radix32tree_find(ngx_radix_tree_t *tree, uint32_t key)
{
    uint32_t           bit;
    uintptr_t          value;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    return value;
}